

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int setup_decode_folder(archive_read *a,_7z_folder *folder,int header)

{
  long lVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  int iVar4;
  char *pcVar5;
  uint64_t uVar6;
  void *pvVar7;
  ssize_t sVar8;
  size_t __n;
  int in_EDX;
  _7z_folder *in_RSI;
  archive *in_RDI;
  _7z_coder *coder;
  int idx [3];
  size_t s [3];
  uint64_t sunpack [3];
  uchar *b [3];
  ssize_t bytes;
  void *buff;
  _7z_coder *scoder [3];
  _7z_coder *fc;
  int found_bcj2;
  int r;
  uint i;
  char *cname;
  _7z_coder *coder2;
  _7z_coder *coder1;
  _7zip *zip;
  archive_read *in_stack_ffffffffffffff00;
  archive_read *a_00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  archive_read *in_stack_ffffffffffffff18;
  long local_c8 [3];
  size_t in_stack_ffffffffffffff50;
  archive_read *in_stack_ffffffffffffff58;
  void *local_a0;
  void *local_98;
  void *local_80;
  _7z_coder *local_78;
  _7z_coder *in_stack_ffffffffffffff90;
  _7z_coder *in_stack_ffffffffffffff98;
  _7zip *in_stack_ffffffffffffffa0;
  archive_read *in_stack_ffffffffffffffa8;
  int local_4c;
  uint local_44;
  _7z_coder *p_Var12;
  int local_4;
  
  lVar1 = *(long *)in_RDI[0x15].archive_format_name;
  pcVar5 = "file content";
  if (in_EDX != 0) {
    pcVar5 = "archive header";
  }
  local_4c = 0;
  for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
    if (*(long *)(lVar1 + 0x4dd8 + (ulong)local_44 * 8) != 0) {
      free(*(void **)(lVar1 + 0x4dd8 + (ulong)local_44 * 8));
    }
    *(undefined8 *)(lVar1 + 0x4dd8 + (ulong)local_44 * 8) = 0;
  }
  *(int *)(lVar1 + 0x114) = (int)in_RSI->numPackedStreams;
  *(uint32_t *)(lVar1 + 0x110) = in_RSI->packIndex;
  uVar6 = folder_uncompressed_size(in_RSI);
  *(uint64_t *)(lVar1 + 0x108) = uVar6;
  *(undefined8 *)(lVar1 + 0xf0) = 0;
  for (local_44 = 0; (ulong)local_44 < in_RSI->numCoders; local_44 = local_44 + 1) {
    uVar2 = in_RSI->coders[local_44].codec;
    if (uVar2 == 0x303011b) {
      local_4c = local_4c + 1;
    }
    else if (((uVar2 == 0x6f10101) || (uVar2 == 0x6f10303)) || (uVar2 == 0x6f10701)) {
      *(undefined4 *)(lVar1 + 0x50a0) = 1;
      lVar1._0_4_ = in_RDI[1].magic;
      lVar1._4_4_ = in_RDI[1].state;
      if (lVar1 != 0) {
        archive_entry_set_is_data_encrypted(*(archive_entry **)(in_RDI + 1),'\x01');
        archive_entry_set_is_metadata_encrypted(*(archive_entry **)(in_RDI + 1),'\x01');
      }
      archive_set_error(in_RDI,-1,"The %s is encrypted, but currently not supported",pcVar5);
      return -0x1e;
    }
  }
  if (*(int *)(lVar1 + 0x50a0) == -1) {
    *(undefined4 *)(lVar1 + 0x50a0) = 0;
  }
  if (((in_RSI->numCoders < 3) || (local_4c != 0)) && (local_4c < 2)) {
    if (in_RSI->numCoders == 2) {
      p_Var12 = in_RSI->coders + 1;
    }
    else {
      p_Var12 = (_7z_coder *)0x0;
    }
    if (local_4c != 0) {
      in_stack_ffffffffffffffa8 = (archive_read *)in_RSI->coders;
      local_78 = &setup_decode_folder::coder_copy;
      in_stack_ffffffffffffff90 = &setup_decode_folder::coder_copy;
      in_stack_ffffffffffffff98 = &setup_decode_folder::coder_copy;
      memset(&stack0xffffffffffffff58,0,0x18);
      local_c8[0] = -1;
      local_c8[1] = 0xffffffffffffffff;
      local_c8[2] = 0xffffffffffffffff;
      memset(&stack0xffffffffffffff18,0,0x18);
      uVar9 = 0;
      uVar10 = 1;
      uVar11 = 2;
      if (((in_RSI->numCoders == 4) &&
          (*(long *)&in_stack_ffffffffffffffa8->skip_file_set == 0x303011b)) &&
         ((in_RSI->numInStreams == 7 &&
          ((in_RSI->numOutStreams == 4 && (*(int *)(lVar1 + 0x114) == 4)))))) {
        if (in_RSI->bindPairs->inIndex == 5) {
          uVar9 = 1;
          uVar10 = 2;
          uVar11 = 0;
          in_stack_ffffffffffffff90 =
               (_7z_coder *)&(in_stack_ffffffffffffffa8->archive).compression_name;
          local_c8[1] = in_RSI->unPackSize[1];
          local_c8[2] = *in_RSI->unPackSize;
          in_stack_ffffffffffffff98 = (_7z_coder *)in_stack_ffffffffffffffa8;
        }
        else {
          uVar2._0_4_ = (in_stack_ffffffffffffffa8->archive).magic;
          uVar2._4_4_ = (in_stack_ffffffffffffffa8->archive).state;
          if (((uVar2 != 0) ||
              ((in_stack_ffffffffffffffa8->archive).compression_name != (char *)0x0)) &&
             (((uVar3._0_4_ = (in_stack_ffffffffffffffa8->archive).magic,
               uVar3._4_4_ = (in_stack_ffffffffffffffa8->archive).state, uVar3 != 0 ||
               ((in_stack_ffffffffffffffa8->archive).error_string.buffer_length != 0)) &&
              (((in_stack_ffffffffffffffa8->archive).compression_name != (char *)0x0 ||
               ((in_stack_ffffffffffffffa8->archive).error_string.buffer_length != 0)))))) {
            archive_set_error(in_RDI,-1,"Unsupported form of BCJ2 streams");
            return -0x1e;
          }
        }
        *(uint64_t *)(lVar1 + 0x4dd0) = in_RSI->unPackSize[2];
      }
      else {
        if ((p_Var12 == (_7z_coder *)0x0) ||
           ((((p_Var12->codec != 0x303011b || (*(int *)(lVar1 + 0x114) != 4)) ||
             (in_RSI->numInStreams != 5)) || (in_RSI->numOutStreams != 2)))) {
          archive_set_error(in_RDI,-1,"Unsupported form of BCJ2 streams");
          return -0x1e;
        }
        *(uint64_t *)(lVar1 + 0x4dd0) = *in_RSI->unPackSize;
      }
      iVar4 = seek_pack((archive_read *)CONCAT44(uVar9,in_stack_ffffffffffffff08));
      if (iVar4 < 0) {
        return iVar4;
      }
      *(undefined8 *)(lVar1 + 0x120) = *(undefined8 *)(lVar1 + 0x118);
      read_consume(in_stack_ffffffffffffff00);
      for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
        a_00 = (archive_read *)(&local_78)[local_44];
        iVar4 = seek_pack((archive_read *)CONCAT44(uVar9,in_stack_ffffffffffffff08));
        if (iVar4 < 0) {
          free(in_stack_ffffffffffffff58);
          free(local_a0);
          free(local_98);
          return iVar4;
        }
        if (local_c8[local_44] == -1) {
          *(undefined8 *)(lVar1 + 0x108) = *(undefined8 *)(lVar1 + 0x118);
        }
        else {
          *(long *)(lVar1 + 0x108) = local_c8[local_44];
        }
        iVar4 = init_decompression(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                   in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        if (iVar4 != 0) {
          free(in_stack_ffffffffffffff58);
          free(local_a0);
          free(local_98);
          return -0x1e;
        }
        pvVar7 = malloc(*(size_t *)(lVar1 + 0x108));
        *(void **)(&stack0xffffffffffffff58 + (ulong)local_44 * 8) = pvVar7;
        if (*(long *)(&stack0xffffffffffffff58 + (ulong)local_44 * 8) == 0) {
          free(in_stack_ffffffffffffff58);
          free(local_a0);
          free(local_98);
          archive_set_error(in_RDI,0xc,"No memory for 7-Zip decompression");
          return -0x1e;
        }
        while (*(long *)(lVar1 + 0x118) != 0) {
          sVar8 = extract_pack_stream(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
          if ((int)sVar8 < 0) {
            free(in_stack_ffffffffffffff58);
            free(local_a0);
            free(local_98);
            return (int)sVar8;
          }
          __n = get_uncompressed_data
                          (in_stack_ffffffffffffff18,(void **)CONCAT44(uVar11,uVar10),
                           CONCAT44(uVar9,in_stack_ffffffffffffff08),(size_t)a_00);
          if ((long)__n < 0) {
            free(in_stack_ffffffffffffff58);
            free(local_a0);
            free(local_98);
            return (int)__n;
          }
          memcpy((void *)(*(long *)(&stack0xffffffffffffff58 + (ulong)local_44 * 8) +
                         *(long *)(&stack0xffffffffffffff18 + (ulong)local_44 * 8)),local_80,__n);
          *(size_t *)(&stack0xffffffffffffff18 + (ulong)local_44 * 8) =
               __n + *(long *)(&stack0xffffffffffffff18 + (ulong)local_44 * 8);
          if (*(long *)(lVar1 + 0x120) != 0) {
            read_consume(a_00);
          }
        }
      }
      for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
        *(undefined8 *)(lVar1 + 0x4dd8 + (ulong)local_44 * 8) =
             *(undefined8 *)
              (&stack0xffffffffffffff58 +
              (long)*(int *)(&stack0xffffffffffffff0c + (ulong)local_44 * 4) * 8);
        *(undefined8 *)(lVar1 + 0x4df0 + (ulong)local_44 * 8) =
             *(undefined8 *)
              (&stack0xffffffffffffff18 +
              (long)*(int *)(&stack0xffffffffffffff0c + (ulong)local_44 * 4) * 8);
        *(undefined8 *)(lVar1 + 0x4e08 + (ulong)local_44 * 8) =
             *(undefined8 *)
              (&stack0xffffffffffffff18 +
              (long)*(int *)(&stack0xffffffffffffff0c + (ulong)local_44 * 4) * 8);
      }
      if (*(long *)(lVar1 + 20000) == 0) {
        *(undefined8 *)(lVar1 + 0x4e28) = 0x8000;
        pvVar7 = malloc(*(size_t *)(lVar1 + 0x4e28));
        *(void **)(lVar1 + 20000) = pvVar7;
        if (*(long *)(lVar1 + 20000) == 0) {
          archive_set_error(in_RDI,0xc,"No memory for 7-Zip decompression");
          return -0x1e;
        }
      }
      *(undefined8 *)(lVar1 + 0x4e30) = 0;
      *(undefined8 *)(lVar1 + 0x4e38) = 0;
      *(undefined8 *)(lVar1 + 0x4db0) = 0;
      *(undefined8 *)(lVar1 + 0x5050) = 0;
      *(undefined4 *)(lVar1 + 0x114) = 1;
      *(uint32_t *)(lVar1 + 0x110) = in_RSI->packIndex;
      uVar6 = folder_uncompressed_size(in_RSI);
      *(uint64_t *)(lVar1 + 0x108) = uVar6;
      *(undefined8 *)(lVar1 + 0xf0) = 0;
    }
    iVar4 = init_decompression(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                               in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    if (iVar4 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = -0x1e;
    }
  }
  else {
    archive_set_error(in_RDI,-1,"The %s is encoded with many filters, but currently not supported",
                      pcVar5);
    local_4 = -0x1e;
  }
  return local_4;
}

Assistant:

static int
setup_decode_folder(struct archive_read *a, struct _7z_folder *folder,
    int header)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const struct _7z_coder *coder1, *coder2;
	const char *cname = (header)?"archive header":"file content";
	unsigned i;
	int r, found_bcj2 = 0;

	/*
	 * Release the memory which the previous folder used for BCJ2.
	 */
	for (i = 0; i < 3; i++) {
		if (zip->sub_stream_buff[i] != NULL)
			free(zip->sub_stream_buff[i]);
		zip->sub_stream_buff[i] = NULL;
	}

	/*
	 * Initialize a stream reader.
	 */
	zip->pack_stream_remaining = (unsigned)folder->numPackedStreams;
	zip->pack_stream_index = (unsigned)folder->packIndex;
	zip->folder_outbytes_remaining = folder_uncompressed_size(folder);
	zip->uncompressed_buffer_bytes_remaining = 0;

	/*
	 * Check coder types.
	 */
	for (i = 0; i < folder->numCoders; i++) {
		switch(folder->coders[i].codec) {
			case _7Z_CRYPTO_MAIN_ZIP:
			case _7Z_CRYPTO_RAR_29:
			case _7Z_CRYPTO_AES_256_SHA_256: {
				/* For entry that is associated with this folder, mark
				   it as encrypted (data+metadata). */
				zip->has_encrypted_entries = 1;
				if (a->entry) {
					archive_entry_set_is_data_encrypted(a->entry, 1);
					archive_entry_set_is_metadata_encrypted(a->entry, 1);
				}
				archive_set_error(&(a->archive),
					ARCHIVE_ERRNO_MISC,
					"The %s is encrypted, "
					"but currently not supported", cname);
				return (ARCHIVE_FATAL);
			}
			case _7Z_X86_BCJ2: {
				found_bcj2++;
				break;
			}
		}
	}
	/* Now that we've checked for encryption, if there were still no
	 * encrypted entries found we can say for sure that there are none.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if ((folder->numCoders > 2 && !found_bcj2) || found_bcj2 > 1) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC,
		    "The %s is encoded with many filters, "
		    "but currently not supported", cname);
		return (ARCHIVE_FATAL);
	}
	coder1 = &(folder->coders[0]);
	if (folder->numCoders == 2)
		coder2 = &(folder->coders[1]);
	else
		coder2 = NULL;

	if (found_bcj2) {
		/*
		 * Preparation to decode BCJ2.
		 * Decoding BCJ2 requires four sources. Those are at least,
		 * as far as I know, two types of the storage form.
		 */
		const struct _7z_coder *fc = folder->coders;
		static const struct _7z_coder coder_copy = {0, 1, 1, 0, NULL};
		const struct _7z_coder *scoder[3] =
			{&coder_copy, &coder_copy, &coder_copy};
		const void *buff;
		ssize_t bytes;
		unsigned char *b[3] = {NULL, NULL, NULL};
		uint64_t sunpack[3] ={-1, -1, -1};
		size_t s[3] = {0, 0, 0};
		int idx[3] = {0, 1, 2};

		if (folder->numCoders == 4 && fc[3].codec == _7Z_X86_BCJ2 &&
		    folder->numInStreams == 7 && folder->numOutStreams == 4 &&
		    zip->pack_stream_remaining == 4) {
			/* Source type 1 made by 7zr or 7z with -m options. */
			if (folder->bindPairs[0].inIndex == 5) {
				/* The form made by 7zr */
				idx[0] = 1; idx[1] = 2; idx[2] = 0;
				scoder[1] = &(fc[1]);
				scoder[2] = &(fc[0]);
				sunpack[1] = folder->unPackSize[1];
				sunpack[2] = folder->unPackSize[0];
				coder1 = &(fc[2]);
			} else {
				/*
				 * NOTE: Some patterns do not work.
				 * work:
				 *  7z a -m0=BCJ2 -m1=COPY -m2=COPY
				 *       -m3=(any)
				 *  7z a -m0=BCJ2 -m1=COPY -m2=(any)
				 *       -m3=COPY
				 *  7z a -m0=BCJ2 -m1=(any) -m2=COPY
				 *       -m3=COPY
				 * not work:
				 *  other patterns.
				 *
				 * We have to handle this like `pipe' or
				 * our libarchive7s filter frame work,
				 * decoding the BCJ2 main stream sequentially,
				 * m3 -> m2 -> m1 -> BCJ2.
				 *
				 */
				if (fc[0].codec == _7Z_COPY &&
				    fc[1].codec == _7Z_COPY)
					coder1 = &(folder->coders[2]);
				else if (fc[0].codec == _7Z_COPY &&
				    fc[2].codec == _7Z_COPY)
					coder1 = &(folder->coders[1]);
				else if (fc[1].codec == _7Z_COPY &&
				    fc[2].codec == _7Z_COPY)
					coder1 = &(folder->coders[0]);
				else {
					archive_set_error(&(a->archive),
					    ARCHIVE_ERRNO_MISC,
					    "Unsupported form of "
					    "BCJ2 streams");
					return (ARCHIVE_FATAL);
				}
			}
			coder2 = &(fc[3]);
			zip->main_stream_bytes_remaining =
				(size_t)folder->unPackSize[2];
		} else if (coder2 != NULL && coder2->codec == _7Z_X86_BCJ2 &&
		    zip->pack_stream_remaining == 4 &&
		    folder->numInStreams == 5 && folder->numOutStreams == 2) {
			/* Source type 0 made by 7z */
			zip->main_stream_bytes_remaining =
				(size_t)folder->unPackSize[0];
		} else {
			/* We got an unexpected form. */
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "Unsupported form of BCJ2 streams");
			return (ARCHIVE_FATAL);
		}

		/* Skip the main stream at this time. */
		if ((r = seek_pack(a)) < 0)
			return (r);
		zip->pack_stream_bytes_unconsumed =
		    (size_t)zip->pack_stream_inbytes_remaining;
		read_consume(a);

		/* Read following three sub streams. */
		for (i = 0; i < 3; i++) {
			const struct _7z_coder *coder = scoder[i];

			if ((r = seek_pack(a)) < 0) {
				free(b[0]); free(b[1]); free(b[2]);
				return (r);
			}

			if (sunpack[i] == (uint64_t)-1)
				zip->folder_outbytes_remaining =
				    zip->pack_stream_inbytes_remaining;
			else
				zip->folder_outbytes_remaining = sunpack[i];

			r = init_decompression(a, zip, coder, NULL);
			if (r != ARCHIVE_OK) {
				free(b[0]); free(b[1]); free(b[2]);
				return (ARCHIVE_FATAL);
			}

			/* Allocate memory for the decorded data of a sub
			 * stream. */
			b[i] = malloc((size_t)zip->folder_outbytes_remaining);
			if (b[i] == NULL) {
				free(b[0]); free(b[1]); free(b[2]);
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}

			/* Extract a sub stream. */
			while (zip->pack_stream_inbytes_remaining > 0) {
				r = (int)extract_pack_stream(a, 0);
				if (r < 0) {
					free(b[0]); free(b[1]); free(b[2]);
					return (r);
				}
				bytes = get_uncompressed_data(a, &buff,
				    zip->uncompressed_buffer_bytes_remaining,
				    0);
				if (bytes < 0) {
					free(b[0]); free(b[1]); free(b[2]);
					return ((int)bytes);
				}
				memcpy(b[i]+s[i], buff, bytes);
				s[i] += bytes;
				if (zip->pack_stream_bytes_unconsumed)
					read_consume(a);
			}
		}

		/* Set the sub streams to the right place. */
		for (i = 0; i < 3; i++) {
			zip->sub_stream_buff[i] = b[idx[i]];
			zip->sub_stream_size[i] = s[idx[i]];
			zip->sub_stream_bytes_remaining[i] = s[idx[i]];
		}

		/* Allocate memory used for decoded main stream bytes. */
		if (zip->tmp_stream_buff == NULL) {
			zip->tmp_stream_buff_size = 32 * 1024;
			zip->tmp_stream_buff =
			    malloc(zip->tmp_stream_buff_size);
			if (zip->tmp_stream_buff == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
		}
		zip->tmp_stream_bytes_avail = 0;
		zip->tmp_stream_bytes_remaining = 0;
		zip->odd_bcj_size = 0;
		zip->bcj2_outPos = 0;

		/*
		 * Reset a stream reader in order to read the main stream
		 * of BCJ2.
		 */
		zip->pack_stream_remaining = 1;
		zip->pack_stream_index = (unsigned)folder->packIndex;
		zip->folder_outbytes_remaining =
		    folder_uncompressed_size(folder);
		zip->uncompressed_buffer_bytes_remaining = 0;
	}

	/*
	 * Initialize the decompressor for the new folder's pack streams.
	 */
	r = init_decompression(a, zip, coder1, coder2);
	if (r != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	return (ARCHIVE_OK);
}